

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input-xkb.c
# Opt level: O2

void wpe_input_xkb_context_get_entries_for_key_code
               (wpe_input_xkb_context *xkb_context,uint32_t key,wpe_input_xkb_keymap_entry **entries
               ,uint32_t *n_entries)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined8 uVar6;
  wpe_input_xkb_keymap_entry *__ptr;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  xkb_keysym_t *syms;
  long local_38;
  
  wpe_input_xkb_context_try_ensure_keymap(xkb_context);
  if (xkb_context->state == (xkb_state *)0x0) {
    __ptr = (wpe_input_xkb_keymap_entry *)0x0;
    uVar9 = 0;
  }
  else {
    uVar6 = xkb_state_get_keymap();
    uVar1 = xkb_keymap_min_keycode(uVar6);
    uVar2 = xkb_keymap_max_keycode(uVar6);
    uVar9 = 0;
    uVar8 = 0;
    __ptr = (wpe_input_xkb_keymap_entry *)0x0;
    for (; uVar1 < uVar2; uVar1 = uVar1 + 1) {
      iVar3 = xkb_keymap_num_layouts_for_key(uVar6,uVar1);
      for (iVar11 = 0; iVar11 != iVar3; iVar11 = iVar11 + 1) {
        iVar4 = xkb_keymap_num_levels_for_key(uVar6,uVar1,iVar11);
        for (iVar7 = 0; iVar7 != iVar4; iVar7 = iVar7 + 1) {
          uVar5 = xkb_keymap_key_get_syms_by_level(uVar6,uVar1,iVar11,iVar7,&local_38);
          uVar10 = (ulong)uVar5;
          if ((int)uVar5 < 1) {
            uVar10 = 0;
          }
          for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
            uVar5 = (uint)uVar9;
            if (*(uint32_t *)(local_38 + uVar12 * 4) == key) {
              uVar5 = uVar5 + 1;
              if ((uint)uVar8 < uVar5) {
                uVar8 = (ulong)((uint)uVar8 + 4);
                __ptr = (wpe_input_xkb_keymap_entry *)realloc(__ptr,uVar8 * 0xc);
                if (__ptr == (wpe_input_xkb_keymap_entry *)0x0) {
                  wpe_alloc_fail("/workspace/llm4binary/github/license_c_cmakelists/WebPlatformForEmbedded[P]libwpe/src/input-xkb.c"
                                 ,0xef,uVar8 * 0xc);
                }
              }
              __ptr[uVar9].hardware_key_code = uVar1;
              __ptr[uVar9].layout = iVar11;
              __ptr[uVar9].level = iVar7;
            }
            uVar9 = (ulong)uVar5;
          }
        }
      }
    }
  }
  *entries = __ptr;
  *n_entries = (uint32_t)uVar9;
  return;
}

Assistant:

void
wpe_input_xkb_context_get_entries_for_key_code(struct wpe_input_xkb_context* xkb_context, uint32_t key, struct wpe_input_xkb_keymap_entry** entries, uint32_t* n_entries)
{
    wpe_input_xkb_context_try_ensure_keymap(xkb_context);
    if (!xkb_context->state) {
        *entries = NULL;
        *n_entries = 0;

        return;
    }

    struct wpe_input_xkb_keymap_entry* array = NULL;
    unsigned array_allocated_size = 0;
    unsigned array_size = 0;

    struct xkb_keymap* keymap = xkb_state_get_keymap(xkb_context->state);
    xkb_keycode_t min_key_code = xkb_keymap_min_keycode(keymap);
    xkb_keycode_t max_key_code = xkb_keymap_max_keycode(keymap);
    xkb_keycode_t key_code;

    for (key_code = min_key_code; key_code < max_key_code; key_code++) {
        xkb_layout_index_t num_layouts = xkb_keymap_num_layouts_for_key(keymap, key_code);
        xkb_layout_index_t layout;

        for (layout = 0; layout < num_layouts; layout++) {
            xkb_level_index_t num_levels = xkb_keymap_num_levels_for_key(keymap, key_code, layout);
            xkb_level_index_t level;

            for (level = 0; level < num_levels; level++) {
                const xkb_keysym_t *syms;
                int num_syms = xkb_keymap_key_get_syms_by_level(keymap, key_code, layout, level, &syms);
                int sym;

                for (sym = 0; sym < num_syms; sym++) {
                    if (syms[sym] == key) {
                        if (++array_size > array_allocated_size) {
                            array_allocated_size += 4;
                            array =
                                wpe_realloc(array, array_allocated_size * sizeof(struct wpe_input_xkb_keymap_entry));
                        }
                        struct wpe_input_xkb_keymap_entry* entry = &array[array_size - 1];

                        entry->hardware_key_code = key_code;
                        entry->layout = layout;
                        entry->level = level;
                    }
                }
            }
        }
    }

    *entries = array;
    *n_entries = array_size;
}